

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GyroscopeSensor.cpp
# Opt level: O2

void __thiscall iDynTree::GyroscopeSensor::GyroscopeSensor(GyroscopeSensor *this)

{
  GyroscopePrivateAttributes *pGVar1;
  Transform aTStack_78 [96];
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor = (_func_int **)&PTR__GyroscopeSensor_001e6a18;
  pGVar1 = (GyroscopePrivateAttributes *)operator_new(0xa8);
  GyroscopePrivateAttributes::GyroscopePrivateAttributes(pGVar1);
  this->pimpl = pGVar1;
  std::__cxx11::string::assign((char *)pGVar1);
  iDynTree::Transform::Identity();
  iDynTree::Transform::operator=(&this->pimpl->link_H_sensor,aTStack_78);
  pGVar1 = this->pimpl;
  pGVar1->parent_link_index = -1;
  std::__cxx11::string::assign((char *)&pGVar1->parent_link_name);
  return;
}

Assistant:

GyroscopeSensor::GyroscopeSensor()
{
    this->pimpl = new GyroscopePrivateAttributes;

    this->pimpl->name = "";
    this->pimpl->link_H_sensor = Transform::Identity();
    this->pimpl->parent_link_index = -1;
    this->pimpl->parent_link_name = "";
}